

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execMoveToSr<(moira::Instr)75,(moira::Mode)9,(moira::Size)2>(Moira *this,u16 opcode)

{
  bool bVar1;
  undefined2 in_SI;
  Moira *in_RDI;
  u32 data;
  u32 ea;
  int src;
  u32 in_stack_ffffffffffffffdc;
  u32 *in_stack_ffffffffffffffe8;
  undefined2 in_stack_fffffffffffffff4;
  
  if (((in_RDI->reg).sr.s & 1U) == 0) {
    execPrivilegeException(in_RDI);
  }
  else {
    bVar1 = readOp<(moira::Mode)9,(moira::Size)2,128ul>
                      (in_RDI,CONCAT22(in_SI,in_stack_fffffffffffffff4),in_stack_ffffffffffffffe8,
                       (u32 *)in_RDI);
    if (bVar1) {
      (*in_RDI->_vptr_Moira[0x19])(in_RDI,4);
      setSR(in_RDI,(u16)(in_stack_ffffffffffffffdc >> 0x10));
      readM<(moira::MemSpace)2,(moira::Size)2,0ul>(in_RDI,in_stack_ffffffffffffffdc);
      prefetch<4ul>(in_RDI);
    }
  }
  return;
}

Assistant:

void
Moira::execMoveToSr(u16 opcode)
{
    SUPERVISOR_MODE_ONLY

    int src = _____________xxx(opcode);

    u32 ea, data;
    if (!readOp <M,S, STD_AE_FRAME> (src, ea, data)) return;

    sync(4);
    setSR(data);

    (void)readM <MEM_PROG, Word> (reg.pc + 2);
    prefetch<POLLIPL>();
}